

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compact_functional_test.cc
# Opt level: O0

void * db_compact_during_compaction_cancellation(void *args)

{
  bool bVar1;
  fdb_config config;
  fdb_status status;
  fdb_file_handle *dbfile;
  timeval __test_interval_ins;
  timeval __test_interval_total;
  timeval __test_cur;
  timeval __test_prev;
  timeval __test_begin;
  fdb_file_handle *in_stack_fffffffffffffd98;
  undefined7 in_stack_fffffffffffffda0;
  undefined1 in_stack_fffffffffffffda7;
  undefined1 local_258 [248];
  undefined1 local_160 [88];
  code *local_108;
  undefined4 local_100;
  undefined8 local_f8;
  fdb_status local_64;
  fdb_config *in_stack_ffffffffffffffb8;
  char *in_stack_ffffffffffffffc0;
  timeval local_18;
  
  gettimeofday(&local_18,(__timezone_ptr_t)0x0);
  fdb_get_default_config();
  memcpy(local_160,local_258,0xf8);
  local_108 = cb_cancel_test;
  local_f8 = 0;
  local_100 = 0x11;
  local_64 = fdb_open((fdb_file_handle **)local_18.tv_sec,in_stack_ffffffffffffffc0,
                      in_stack_ffffffffffffffb8);
  if (local_64 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
            ,0xcac);
    db_compact_during_compaction_cancellation::__test_pass = 0;
    if (local_64 != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                    ,0xcac,"void *db_compact_during_compaction_cancellation(void *)");
    }
  }
  local_64 = fdb_compact((fdb_file_handle *)
                         CONCAT17(in_stack_fffffffffffffda7,in_stack_fffffffffffffda0),
                         (char *)in_stack_fffffffffffffd98);
  if (((local_64 != FDB_RESULT_SUCCESS) && (local_64 != FDB_RESULT_COMPACTION_CANCELLATION)) &&
     (local_64 != FDB_RESULT_FAIL_BY_ROLLBACK)) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
            ,0xcb1);
    db_compact_during_compaction_cancellation::__test_pass = 0;
    bVar1 = true;
    if ((local_64 != FDB_RESULT_SUCCESS) &&
       (bVar1 = true, local_64 != FDB_RESULT_COMPACTION_CANCELLATION)) {
      bVar1 = local_64 == FDB_RESULT_FAIL_BY_ROLLBACK;
    }
    if (!bVar1) {
      __assert_fail("status == FDB_RESULT_SUCCESS || status == FDB_RESULT_COMPACTION_CANCELLATION || status == FDB_RESULT_FAIL_BY_ROLLBACK"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                    ,0xcb1,"void *db_compact_during_compaction_cancellation(void *)");
    }
  }
  fdb_close(in_stack_fffffffffffffd98);
  pthread_exit((void *)0x0);
}

Assistant:

void *db_compact_during_compaction_cancellation(void *args)
{

    TEST_INIT();

    fdb_file_handle *dbfile;
    fdb_status status;
    fdb_config config;

    // Open Database File
    config = fdb_get_default_config();
    config.compaction_cb = cb_cancel_test;
    config.compaction_cb_ctx = NULL;
    config.compaction_cb_mask = FDB_CS_BEGIN | FDB_CS_END;

    status = fdb_open(&dbfile, "compact_test", &config);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    // compaction thread enters here
    status = fdb_compact(dbfile, NULL);
    TEST_CHK(status == FDB_RESULT_SUCCESS ||
             status == FDB_RESULT_COMPACTION_CANCELLATION ||
             status == FDB_RESULT_FAIL_BY_ROLLBACK);
    fdb_close(dbfile);

    // shutdown
    thread_exit(0);
    return NULL;
}